

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

bool anon_unknown.dwarf_5a0b1::parse_str_to_bool(string *s)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char *in_stack_ffffffffffffffe8;
  
  bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
  if ((((!bVar1) && (bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8), !bVar1)) &&
      (bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8), !bVar1)) &&
     (bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8), !bVar1)) {
    return false;
  }
  return true;
}

Assistant:

bool parse_str_to_bool(const std::string & s) {
    if (s == "true" || s == "1" || s == "yes" || s == "y") {
        return true;
    }
    return false;
}